

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O2

void __thiscall Noise::setParameter(Noise *this,string *name,string *value)

{
  bool bVar1;
  long lVar2;
  double d;
  stringstream param;
  undefined8 local_1a8;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,(string *)value);
  std::istream::_M_extract<double>((double *)local_1a0);
  bVar1 = std::operator==(name,"mean");
  lVar2 = 0x90;
  if (!bVar1) {
    bVar1 = std::operator==(name,"std.dev.");
    lVar2 = 0x98;
    if (!bVar1) {
      bVar1 = std::operator==(name,"weight");
      lVar2 = 0x80;
      if (!bVar1) {
        bVar1 = std::operator==(name,"rate");
        lVar2 = 0x88;
        if (!bVar1) {
          Parametric::setParameter((Parametric *)this,name,value);
          goto LAB_00136927;
        }
      }
    }
  }
  (**(code **)((long)(this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                     _vptr_Parametric + lVar2))(local_1a8,this);
LAB_00136927:
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void Noise::setParameter( const string& name, const string& value )
{
	stringstream param;
	double d;
	param << value;
	param >> d;
	
	if (name == "mean")
		setMean(d);
	else if (name == "std.dev.")
		setStdDev(d);
	else if (name == "weight")
		setWeight(d);
	else if (name == "rate")
		setRate(d);
	else
		StochasticVariable::setParameter(name, value);
}